

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

Literal * __thiscall wasm::Literal::floorF64x2(Literal *__return_storage_ptr__,Literal *this)

{
  long lVar1;
  Literal *this_00;
  double extraout_XMM0_Qa;
  double __x;
  double extraout_XMM0_Qa_00;
  Literal local_70;
  undefined1 local_58 [8];
  LaneArray<2> lanes;
  
  getLanesF64x2((LaneArray<2> *)local_58,this);
  lVar1 = 0;
  __x = extraout_XMM0_Qa;
  do {
    this_00 = (Literal *)(local_58 + lVar1);
    floor(&local_70,__x);
    if (this_00 != &local_70) {
      ~Literal(this_00);
      Literal(this_00,&local_70);
    }
    ~Literal(&local_70);
    lVar1 = lVar1 + 0x18;
    __x = extraout_XMM0_Qa_00;
  } while (lVar1 == 0x18);
  Literal(__return_storage_ptr__,(LaneArray<2> *)local_58);
  lVar1 = 0x18;
  do {
    ~Literal((Literal *)(local_58 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::floorF64x2() const {
  return unary<2, &Literal::getLanesF64x2, &Literal::floor>(*this);
}